

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

bool __thiscall FIX::Session::resend(Session *this,Message *message)

{
  Header *this_00;
  FieldBase *this_01;
  FieldBase local_88;
  
  this_00 = &message->m_header;
  this_01 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x34);
  FieldMap::getFieldRef(&this_00->super_FieldMap,0x22);
  UtcTimeStampField::getValue((UtcTimeStamp *)&local_88,(UtcTimeStampField *)this_01);
  insertOrigSendingTime(this,this_00,(UtcTimeStamp *)&local_88);
  BoolField::BoolField((BoolField *)&local_88,0x2b,true);
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f7090;
  FieldMap::setField(&this_00->super_FieldMap,&local_88,true);
  FieldBase::~FieldBase(&local_88);
  insertSendingTime(this,this_00);
  (**(code **)(*(long *)this->m_application + 0x30))(this->m_application,message,&this->m_sessionID)
  ;
  return true;
}

Assistant:

bool Session::resend(Message &message) {
  Header &header = message.getHeader();
  auto const &sendingTime = header.getField<SendingTime>();
  header.getField<MsgSeqNum>();
  insertOrigSendingTime(header, sendingTime);
  header.setField(PossDupFlag(true));
  insertSendingTime(header);

  try {
    m_application.toApp(message, m_sessionID);
    return true;
  } catch (DoNotSend &) {
    return false;
  }
}